

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::setObjectiveLimit(HighsLpRelaxation *this,double objlim)

{
  bool bVar1;
  pointer pHVar2;
  double *pdVar3;
  int __x;
  Highs *in_RDI;
  double extraout_XMM0_Qa;
  double offset;
  HighsSolution *value;
  string *option;
  undefined1 local_49 [33];
  double local_28;
  double local_20;
  double local_18;
  
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x608678);
  bVar1 = HighsObjectiveFunction::isIntegral(&pHVar2->objectiveFunction);
  if (bVar1) {
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6086a1);
    local_18 = HighsObjectiveFunction::integralScale(&pHVar2->objectiveFunction);
    local_18 = 0.5 / local_18;
  }
  else {
    __x = (int)in_RDI->_vptr_Highs + 0xe0;
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6086db);
    local_20 = pHVar2->feastol * 1000.0;
    std::abs(__x);
    local_28 = extraout_XMM0_Qa * 1e-14;
    pdVar3 = std::max<double>(&local_20,&local_28);
    local_18 = *pdVar3;
  }
  value = &in_RDI->solution_;
  option = (string *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"objective_bound",(allocator *)option);
  Highs::setOptionValue(in_RDI,option,(double)value);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  return;
}

Assistant:

void HighsLpRelaxation::setObjectiveLimit(double objlim) {
  double offset;
  if (mipsolver.mipdata_->objectiveFunction.isIntegral())
    offset = 0.5 / mipsolver.mipdata_->objectiveFunction.integralScale();
  else
    offset = std::max(1000.0 * mipsolver.mipdata_->feastol,
                      std::abs(objlim) * kHighsTiny);

  lpsolver.setOptionValue("objective_bound", objlim + offset);
}